

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

StringPtr capnp::operator*(int param_1)

{
  Equality res_local;
  
  if (param_1 == 0) {
    kj::StringPtr::StringPtr((StringPtr *)&res_local,"NOT_EQUAL");
  }
  else if (param_1 == 1) {
    kj::StringPtr::StringPtr((StringPtr *)&res_local,"EQUAL");
  }
  else {
    if (param_1 != 2) {
      kj::_::unreachable();
    }
    kj::StringPtr::StringPtr((StringPtr *)&res_local,"UNKNOWN_CONTAINS_CAPS");
  }
  return (StringPtr)_res_local;
}

Assistant:

kj::StringPtr KJ_STRINGIFY(Equality res) {
  switch(res) {
    case Equality::NOT_EQUAL:
      return "NOT_EQUAL";
    case Equality::EQUAL:
      return "EQUAL";
    case Equality::UNKNOWN_CONTAINS_CAPS:
      return "UNKNOWN_CONTAINS_CAPS";
  }
  KJ_UNREACHABLE;
}